

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator=(CFastSet<unsigned_int> *this,CSet *set)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  uint *puVar5;
  reference puVar6;
  _Self local_30;
  _Self local_28;
  const_iterator j;
  int i;
  CSet *set_local;
  CFastSet<unsigned_int> *this_local;
  
  if (this->elements != (uint *)0x0) {
    operator_delete__(this->elements);
  }
  sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size(set);
  this->elementsSize = (int)sVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->elementsSize;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (uint *)operator_new__(uVar4);
  this->elements = puVar5;
  j._M_node._4_4_ = 0;
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin(set);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end(set);
    bVar2 = std::operator!=(&local_28,&local_30);
    if (!bVar2) break;
    puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_28);
    this->elements[j._M_node._4_4_] = *puVar6;
    j._M_node._4_4_ = j._M_node._4_4_ + 1;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_28);
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=(const CSet& set)
{
	delete[] elements;
	elementsSize = set.size();
	elements = new T[elementsSize];
	
	int i = 0;
	for( typename CSet::const_iterator j = set.begin(); j != set.end(); ++j ) {
		elements[i] = *j;
		i++;
	}

	return *this;
}